

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

bool __thiscall slang::parsing::Parser::isConditionalExpression(Parser *this)

{
  uint32_t offset;
  bool bVar1;
  Token TVar2;
  TokenKind local_30;
  uint32_t local_1c;
  TokenKind kind;
  Parser *pPStack_18;
  uint32_t index;
  Parser *this_local;
  
  local_1c = 1;
  pPStack_18 = this;
  do {
    offset = local_1c;
    local_1c = local_1c + 1;
    TVar2 = ParserBase::peek(&this->super_ParserBase,offset);
    local_30 = TVar2.kind;
    switch(local_30) {
    case OpenBrace:
      bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                        (this,&local_1c,OpenBrace,CloseBrace);
      if (!bVar1) {
        return false;
      }
      break;
    default:
      bVar1 = slang::syntax::SyntaxFacts::isNotInType(local_30);
      if (bVar1) {
        return false;
      }
      break;
    case OpenBracket:
      bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                        (this,&local_1c,OpenBracket,CloseBracket);
      if (!bVar1) {
        return false;
      }
      break;
    case OpenParenthesis:
      bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                        (this,&local_1c,OpenParenthesis,CloseParenthesis);
      if (!bVar1) {
        return false;
      }
      break;
    case CloseParenthesis:
      return false;
    case Question:
      return true;
    }
  } while( true );
}

Assistant:

bool Parser::isConditionalExpression() {
    uint32_t index = 1;
    while (true) {
        TokenKind kind = peek(index++).kind;
        switch (kind) {
            case TokenKind::Question:
                return true;
            case TokenKind::CloseParenthesis:
                return false;
            case TokenKind::OpenParenthesis:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                               TokenKind::CloseParenthesis)) {
                    return false;
                }
                break;
            case TokenKind::OpenBrace:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenBrace,
                                               TokenKind::CloseBrace)) {
                    return false;
                }
                break;
            case TokenKind::OpenBracket:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenBracket,
                                               TokenKind::CloseBracket)) {
                    return false;
                }
                break;
            default:
                if (isNotInType(kind))
                    return false;
                break;
        }
    }
}